

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *this,ExtDepGraph *x)

{
  ExtDepGraph *p;
  DeleteObject deleter;
  DeleteObject local_11;
  
  p = (ExtDepGraph *)(this->ptr_ & 0xfffffffffffffffe);
  if ((this->ptr_ & 1) != 0 && p != x) {
    this->ptr_ = (uintp)p;
    DeleteObject::operator()(&local_11,p);
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}